

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor2008.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::PFor2008::decodeArray
          (PFor2008 *this,uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint32_t *puVar4;
  logic_error *this_00;
  uint32_t *puVar5;
  size_t sVar6;
  size_t thisnvalue;
  size_t local_38;
  
  uVar1 = *in;
  puVar5 = in + 1;
  *nvalue = (ulong)uVar1;
  puVar4 = puVar5;
  if ((ulong)uVar1 != 0) {
    uVar3 = *nvalue;
    if (uVar3 == 0) {
      sVar6 = 0;
    }
    else {
      sVar6 = 0;
      do {
        local_38 = uVar3 - sVar6;
        uVar2 = *puVar4;
        puVar4 = puVar4 + 1;
        if (uVar2 == 8) {
          puVar4 = __decodeArray<unsigned_char>
                             (this,puVar4,(long)((long)puVar5 + (len * 4 - (long)puVar4)) >> 2,out,
                              &local_38);
        }
        else if (uVar2 == 0x10) {
          puVar4 = __decodeArray<unsigned_short>
                             (this,puVar4,(long)((long)puVar5 + (len * 4 - (long)puVar4)) >> 2,out,
                              &local_38);
        }
        else {
          if (uVar2 != 0x20) {
            this_00 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(this_00,"corrupted?");
            __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          puVar4 = __decodeArray<unsigned_int>
                             (this,puVar4,(long)((long)puVar5 + (len * 4 - (long)puVar4)) >> 2,out,
                              &local_38);
        }
        out = out + local_38;
        sVar6 = sVar6 + local_38;
        uVar3 = *nvalue;
      } while (sVar6 < uVar3);
    }
    *nvalue = sVar6;
  }
  return puVar4;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t len,
                              uint32_t *out, size_t &nvalue) override {
    nvalue = *in++;
    if (nvalue == 0)
      return in;
#ifndef NDEBUG
    const uint32_t *const initin = in;
#endif
    const uint32_t *const finalin = in + len;
    size_t totalnvalue(0);
    while (totalnvalue < nvalue) {
      size_t thisnvalue = nvalue - totalnvalue;
#ifndef NDEBUG
      const uint32_t *const befin(in);
#endif
      assert(finalin <= len + in);
      const uint32_t maxb = *in++;
      if (maxb == 32) {
        in = __decodeArray<uint32_t>(in, finalin - in, out, thisnvalue);
      } else if (maxb == 16) {
        in = __decodeArray<uint16_t>(in, finalin - in, out, thisnvalue);
      } else if (maxb == 8) {
        in = __decodeArray<uint8_t>(in, finalin - in, out, thisnvalue);
      } else {
        throw std::logic_error("corrupted?");
      }
      assert(in > befin);
      assert(in <= finalin);
      out += thisnvalue;
      totalnvalue += thisnvalue;
      assert(totalnvalue <= nvalue);
    }
    assert(in <= len + initin);
    assert(in <= finalin);
    nvalue = totalnvalue;
    return in;
  }